

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles2::Functional::anon_unknown_1::UniformCollection::containsMatchingBasicType
          (UniformCollection *this,dataTypePredicate predicate)

{
  pointer pUVar1;
  bool bVar2;
  long lVar3;
  VarType *type;
  long lVar4;
  long lVar5;
  
  lVar4 = 0x20;
  lVar5 = -1;
  do {
    pUVar1 = (this->m_uniforms).
             super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar3 = (long)(int)(((long)(this->m_uniforms).
                               super__Vector_base<deqp::gles2::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::Uniform>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1) / 0x38);
    lVar5 = lVar5 + 1;
    if (lVar3 <= lVar5) break;
    type = (VarType *)((long)&(pUVar1->name)._M_dataplus + lVar4);
    lVar4 = lVar4 + 0x38;
    bVar2 = typeContainsMatchingBasicType(type,predicate);
  } while (!bVar2);
  return lVar5 < lVar3;
}

Assistant:

bool containsMatchingBasicType (const dataTypePredicate predicate) const
	{
		for (int i = 0; i < (int)m_uniforms.size(); i++)
			if (typeContainsMatchingBasicType(m_uniforms[i].type, predicate))
				return true;
		return false;
	}